

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitStringTest_x_iutest_x_ToHexString_Test::Body
          (iu_UnitStringTest_x_iutest_x_ToHexString_Test *this)

{
  AssertionResult iutest_ar;
  iuCodeMessage local_330;
  Fixed local_300;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iutest::detail::ToHexString<unsigned_char>(&local_38,'\0');
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"00\"","::iutest::detail::ToHexString< ::iutest::UInt8 >(0)",
             "00",(char *)&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xc6,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<unsigned_short>(&local_58,0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"0000\"",
             "::iutest::detail::ToHexString< ::iutest::UInt16 >(0)","0000",(char *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,199,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<unsigned_int>(&local_78,0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"00000000\"",
             "::iutest::detail::ToHexString< ::iutest::UInt32 >(0)","00000000",(char *)&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_78);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,200,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<unsigned_long>(&local_98,0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"0000000000000000\"",
             "::iutest::detail::ToHexString< ::iutest::UInt64 >(0)","0000000000000000",
             (char *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_98);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xc9,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<long>(&local_b8,-1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"FFFFFFFFFFFFFFFF\"",
             "::iutest::detail::ToHexString< ::iutest::Int64 >(-1)","FFFFFFFFFFFFFFFF",
             (char *)&local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b8);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xca,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<long>(&local_d8,0x7fffffffffffffff);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"7FFFFFFFFFFFFFFF\"",
             "::iutest::detail::ToHexString< ::iutest::Int64 >((9223372036854775807L))",
             "7FFFFFFFFFFFFFFF",(char *)&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d8);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xcc,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<long>(&local_f8,-0x8000000000000000);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"8000000000000000\"",
             "::iutest::detail::ToHexString< ::iutest::Int64 >((-9223372036854775807L-1))",
             "8000000000000000",(char *)&local_f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_f8);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xcd,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<unsigned_int>(&local_118,0x1234567);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"01234567\"","::iutest::detail::ToHexString(0x01234567u)",
             "01234567",(char *)&local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_118);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xcf,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<char>(&local_138,"ABC",-1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"414243\"","::iutest::detail::ToHexString(\"ABC\", -1)",
             "414243",(char *)&local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_138);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xd0,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<char>(&local_158,"ABC",2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"4142\"","::iutest::detail::ToHexString(\"ABC\", 2)","4142",
             (char *)&local_158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_158);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xd1,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::ToHexString<char>(&local_178,"ABC",0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"\"\"","::iutest::detail::ToHexString(\"ABC\", 0)","",
             (char *)&local_178,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)iutest_ar.m_message._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_178);
  if (iutest_ar.m_result == false) {
    memset(&local_300,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xd2,iutest_ar.m_message._M_dataplus._M_p);
    local_330._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_330,&local_300);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_300);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(UnitStringTest, ToHexString)
{
    IUTEST_EXPECT_STREQ(              "00", ::iutest::detail::ToHexString< ::iutest::UInt8  >(0));
    IUTEST_EXPECT_STREQ(            "0000", ::iutest::detail::ToHexString< ::iutest::UInt16 >(0));
    IUTEST_EXPECT_STREQ(        "00000000", ::iutest::detail::ToHexString< ::iutest::UInt32 >(0));
    IUTEST_EXPECT_STREQ("0000000000000000", ::iutest::detail::ToHexString< ::iutest::UInt64 >(0));
    IUTEST_EXPECT_STREQ("FFFFFFFFFFFFFFFF", ::iutest::detail::ToHexString< ::iutest::Int64 >(-1));
#if defined(INT64_MAX)
    IUTEST_EXPECT_STREQ("7FFFFFFFFFFFFFFF", ::iutest::detail::ToHexString< ::iutest::Int64 >(INT64_MAX));
    IUTEST_EXPECT_STREQ("8000000000000000", ::iutest::detail::ToHexString< ::iutest::Int64 >(INT64_MIN));
#endif
    IUTEST_EXPECT_STREQ(        "01234567", ::iutest::detail::ToHexString(0x01234567u));
    IUTEST_EXPECT_STREQ(          "414243", ::iutest::detail::ToHexString("ABC", -1));
    IUTEST_EXPECT_STREQ(            "4142", ::iutest::detail::ToHexString("ABC", 2));
    IUTEST_EXPECT_STREQ(                "", ::iutest::detail::ToHexString("ABC", 0));
}